

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall httplib::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  socket_t sock;
  Response *res_local;
  Request *req_local;
  Client *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar1 = create_client_socket(this);
    uVar3 = CONCAT44(extraout_var,uVar1);
    if (uVar1 == 0xffffffff) {
      this_local._7_1_ = 0;
    }
    else {
      iVar2 = (*this->_vptr_Client[3])(this,(ulong)uVar1,CONCAT44(in_register_00000034,__fd),__buf);
      uVar3 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar2) >> 8),(char)iVar2) &
              0xffffffffffffff01;
      this_local._7_1_ = (undefined1)uVar3;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return CONCAT71((int7)(uVar3 >> 8),this_local._7_1_);
}

Assistant:

inline bool Client::send(Request& req, Response& res)
{
    if (req.path.empty()) {
        return false;
    }

    auto sock = create_client_socket();
    if (sock == INVALID_SOCKET) {
        return false;
    }

    return read_and_close_socket(sock, req, res);
}